

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateRepeatedPrimitiveHelperMethods
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field,
          bool untyped)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long *plVar3;
  size_type *psVar4;
  FieldDescriptor *field_00;
  char *pcVar5;
  char *pcVar6;
  BytesMode bytes_mode;
  undefined7 in_register_00000081;
  undefined1 in_R9B;
  char *pcVar7;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bytes_mode = (BytesMode)CONCAT71(in_register_00000081,untyped);
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_90,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
             (GeneratorOptions *)(options->namespace_prefix)._M_string_length,
             *(Descriptor **)(field + 0x58));
  (anonymous_namespace)::JSGetterName_abi_cxx11_
            (&local_b0,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,(FieldDescriptor *)0x1
             ,bytes_mode,(bool)in_R9B);
  (anonymous_namespace)::JSTypeName_abi_cxx11_
            (&local_d0,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
             (FieldDescriptor *)0x0,bytes_mode);
  (anonymous_namespace)::JSFieldIndex_abi_cxx11_(&local_70,(_anonymous_namespace_ *)field,field_00);
  io::Printer::Print(printer,
                     "/**\n * @param {!$optionaltype$} value\n * @param {number=} opt_index\n */\n$class$.prototype.add$name$ = function(value, opt_index) {\n  jspb.Message.addToRepeatedField(this, $index$"
                     ,"class",&local_90,"name",&local_b0,"optionaltype",&local_d0,"index",&local_70)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pcVar6 = "/** @type{string|number|boolean|!Uint8Array} */(";
  pcVar7 = "";
  if (!untyped) {
    pcVar6 = "";
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar5 = pcVar6 + 0x30;
  if (!untyped) {
    pcVar5 = pcVar6;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar6,pcVar5);
  if (untyped) {
    pcVar7 = ")";
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,pcVar7,pcVar7 + untyped);
  lVar2 = *(long *)(field + 0x60);
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  if (lVar2 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
  }
  else {
    (anonymous_namespace)::JSOneofArray_abi_cxx11_
              (&local_70,(_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(options->namespace_prefix)._M_string_length,field);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x36a640);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_d0.field_2._M_allocated_capacity = *psVar4;
      local_d0.field_2._8_8_ = plVar3[3];
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar4;
      local_d0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_d0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  io::Printer::Print(printer,
                     "$oneofgroup$, $type$value$rptvalueinit$$typeclose$, opt_index);\n};\n\n\n",
                     "type",&local_90,"typeclose",&local_b0,"oneofgroup",&local_d0,"rptvalueinit",
                     &local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((lVar2 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Generator::GenerateRepeatedPrimitiveHelperMethods(
    const GeneratorOptions& options, io::Printer* printer,
    const FieldDescriptor* field, bool untyped) const {
  printer->Print(
      "/**\n"
      " * @param {!$optionaltype$} value\n"
      " * @param {number=} opt_index\n"
      " */\n"
      "$class$.prototype.add$name$ = function(value, opt_index) {\n"
      "  jspb.Message.addToRepeatedField(this, $index$",
      "class", GetMessagePath(options, field->containing_type()),
      "name", JSGetterName(options, field, BYTES_DEFAULT,
                   /* drop_list = */ true),
      "optionaltype", JSTypeName(options, field, BYTES_DEFAULT), "index",
      JSFieldIndex(field));
  printer->Print(
      "$oneofgroup$, $type$value$rptvalueinit$$typeclose$, opt_index);\n"
      "};\n"
      "\n"
      "\n",
      "type", untyped ? "/** @type{string|number|boolean|!Uint8Array} */(" : "",
      "typeclose", untyped ? ")" : "", "oneofgroup",
      (field->containing_oneof() ? (", " + JSOneofArray(options, field)) : ""),
      "rptvalueinit", "");
}